

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O1

int Gia_ObjFaninC2(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  
  if (p->pMuxes == (uint *)0x0) {
    uVar2 = 0;
  }
  else {
    pGVar1 = p->pObjs;
    if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar2 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555];
    if ((int)uVar2 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x130,"int Abc_LitIsCompl(int)");
    }
    uVar2 = uVar2 & 1;
  }
  return uVar2;
}

Assistant:

static inline int          Gia_ObjFaninC2( Gia_Man_t * p, Gia_Obj_t * pObj )   { return p->pMuxes && Abc_LitIsCompl(p->pMuxes[Gia_ObjId(p, pObj)]);  }